

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O2

bool idx2::OptVal(int NArgs,cstr *Args,cstr Opt,array<int> *Vals)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  byte bVar5;
  array<int> *paVar6;
  long lVar7;
  long lVar8;
  int X;
  anon_union_8_2_2df48d06_for_stref_0 local_40;
  undefined4 local_38;
  
  *(undefined8 *)(Vals + 0x18) = 0;
  paVar6 = Vals;
  for (lVar7 = 1; bVar5 = (byte)paVar6, lVar7 < NArgs; lVar7 = lVar7 + 1) {
    iVar2 = strncmp(Args[lVar7],Opt,0x20);
    if (iVar2 == 0) {
      lVar8 = lVar7 + -1;
      goto LAB_00103c98;
    }
  }
LAB_00103cfd:
  return (bool)(lVar7 < NArgs & bVar5);
LAB_00103c98:
  if (NArgs <= (int)lVar8 + 2) goto LAB_00103cf4;
  local_40 = (anon_union_8_2_2df48d06_for_stref_0)
             ((anon_union_8_2_2df48d06_for_stref_0 *)(Args + lVar8 + 2))->Ptr;
  sVar3 = strlen(local_40.Ptr);
  local_38 = (undefined4)sVar3;
  bVar1 = ToInt((stref *)&local_40,&X);
  if (!bVar1) goto LAB_00103cf4;
  lVar4 = *(long *)(Vals + 0x18);
  if (*(long *)(Vals + 0x20) <= lVar4) {
    GrowCapacity<int>(Vals,0);
    lVar4 = *(long *)(Vals + 0x18);
  }
  *(long *)(Vals + 0x18) = lVar4 + 1;
  *(int *)(*(long *)Vals + lVar4 * 4) = X;
  lVar8 = lVar8 + 1;
  goto LAB_00103c98;
LAB_00103cf4:
  bVar5 = (uint)lVar7 < (int)lVar8 + 1U;
  goto LAB_00103cfd;
}

Assistant:

bool
OptVal(int NArgs, cstr* Args, cstr Opt, array<int>* Vals)
{
  Clear(Vals);
  for (int I = 1; I < NArgs; ++I)
  {
    if (strncmp(Args[I], Opt, 32) == 0)
    {
      int J = I;
      while (true)
      {
        ++J;
        int X;
        if (J < NArgs && ToInt(Args[J], &X))
          PushBack(Vals, X);
        else
          break;
      }
      return J > I + 1;
    }
  }

  return false;
}